

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastToTimestampMS::Operation<duckdb::string_t,duckdb::timestamp_t>
               (string_t input,timestamp_t *result,bool strict)

{
  bool bVar1;
  timestamp_t tVar2;
  
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::timestamp_t>(input,result,false);
  if (bVar1) {
    tVar2 = CastTimestampUsToMs::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(result->value);
    result->value = (int64_t)tVar2;
  }
  return bVar1;
}

Assistant:

bool TryCastToTimestampMS::Operation(string_t input, timestamp_t &result, bool strict) {
	if (!TryCast::Operation<string_t, timestamp_t>(input, result, strict)) {
		return false;
	}
	result = CastTimestampUsToMs::Operation<timestamp_t, timestamp_t>(result);
	return true;
}